

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

bool DnsStats::IsIpv4Name(uint8_t *name,size_t name_length)

{
  bool bVar1;
  bool bVar2;
  uint local_38;
  int local_34;
  int c;
  int r;
  int mult;
  bool is_ipv4;
  size_t i;
  int nb_num_dot;
  size_t name_length_local;
  uint8_t *name_local;
  
  i._4_4_ = 0;
  bVar2 = true;
  _mult = name_length;
  do {
    bVar1 = false;
    if ((_mult != 0) && (bVar1 = false, bVar2)) {
      bVar1 = i._4_4_ < 4;
    }
    if (!bVar1) {
      return (bool)(bVar2 & i._4_4_ == 4);
    }
    c = 1;
    local_34 = 0;
    local_38 = 0;
    while (bVar2 && _mult != 0) {
      _mult = _mult - 1;
      local_38 = (uint)name[_mult];
      if ((local_38 < 0x30) || (0x39 < local_38)) break;
      if (c < 1000) {
        local_34 = c * (local_38 - 0x30) + local_34;
        c = c * 10;
      }
      else {
        bVar2 = false;
      }
    }
    if (bVar2) {
      if (((_mult == 0) || (local_38 == 0x2e)) && (local_34 < 0x100)) {
        i._4_4_ = i._4_4_ + 1;
      }
      else {
        bVar2 = false;
      }
    }
  } while( true );
}

Assistant:

bool DnsStats::IsIpv4Name(const uint8_t * name, size_t name_length)
{
    int nb_num_dot = 0;
    size_t i;
    bool is_ipv4 = true;

    i = name_length;
    while (i > 0 && is_ipv4 && nb_num_dot < 4) {
        int mult = 1;
        int r = 0;
        int c = 0;

        while (is_ipv4 && i > 0) {
            i--;
            c = name[i];
            if (c >= '0' && c <= '9') {
                if (mult < 1000) {
                    r += mult * (c - '0');
                    mult *= 10;
                }
                else {
                    is_ipv4 = false;
                }
            }
            else {
                break;
            }
        }

        if (is_ipv4) {
            if ((i == 0 || c == '.') && r < 256) {
                nb_num_dot++;
            }
            else {
                is_ipv4 = false;
            }
        }
    }

    is_ipv4 &= (nb_num_dot == 4);

    return is_ipv4;
}